

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multipartExamples.cpp
# Opt level: O1

void resizeDeepBuffers<unsigned_int>
               (Array2D<unsigned_int> *sampleCount,
               list<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
               *channels)

{
  _List_node_base *p_Var1;
  long lVar2;
  void *pvVar3;
  _List_node_base *p_Var4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  for (p_Var1 = (channels->
                super__List_base<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                )._M_impl._M_node.super__List_node_base._M_next;
      p_Var1 != (_List_node_base *)channels;
      p_Var1 = (((_List_base<Imf_3_4::Array2D<unsigned_int_*>,_std::allocator<Imf_3_4::Array2D<unsigned_int_*>_>_>
                  *)&p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
    if (0 < (long)p_Var1[1]._M_next) {
      lVar2 = sampleCount->_sizeY;
      lVar9 = 0;
      lVar6 = 0;
      lVar5 = 0;
      do {
        p_Var4 = p_Var1[1]._M_prev;
        if (0 < (long)p_Var4) {
          lVar8 = 0;
          do {
            uVar7 = (ulong)*(uint *)((long)sampleCount->_data + lVar8 * 4 + lVar9);
            if (uVar7 == 0) {
              pvVar3 = (void *)0x0;
            }
            else {
              pvVar3 = operator_new__(uVar7 << 2);
              p_Var4 = p_Var1[1]._M_prev;
            }
            *(void **)(*(long *)(p_Var1 + 1 + 1) + lVar8 * 8 + (long)p_Var4 * lVar6) = pvVar3;
            lVar8 = lVar8 + 1;
            p_Var4 = p_Var1[1]._M_prev;
          } while (lVar8 < (long)p_Var4);
        }
        lVar5 = lVar5 + 1;
        lVar6 = lVar6 + 8;
        lVar9 = lVar9 + lVar2 * 4;
      } while (lVar5 < (long)p_Var1[1]._M_next);
    }
  }
  return;
}

Assistant:

void
resizeDeepBuffers (Array2D<uint32_t>& sampleCount, list<Array2D<T*>>& channels)
{
    //
    // Allocate memory for samples in all pixel buffers according to the data in sampleCount buffer.
    //

    for (auto i = channels.begin (); i != channels.end (); i++)
    {
        Array2D<T*>& channel = *i;
        for (int y = 0; y < channel.height (); y++)
        {
            for (int x = 0; x < channel.width (); x++)
            {
                uint32_t count = sampleCount[y][x];
                if (count)
                    channel[y][x]  = new T[count];
                else
                    channel[y][x]  = nullptr;
            }
        }
    }
}